

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubFodderBuilders.cpp
# Opt level: O3

void __thiscall SubFodderBuilderB::SubFodderBuilderB(SubFodderBuilderB *this)

{
  Fodder *pFVar1;
  
  (this->super_FodderBuilder)._vptr_FodderBuilder = (_func_int **)&PTR_addIngredientA_00115ab8;
  pFVar1 = (Fodder *)operator_new(0x40);
  (pFVar1->_ingredientB)._M_dataplus._M_p = (pointer)0x0;
  (pFVar1->_ingredientB)._M_string_length = 0;
  (pFVar1->_ingredientB).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pFVar1->_ingredientB).field_2 + 8) = 0;
  (pFVar1->_ingredientA).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pFVar1->_ingredientA).field_2 + 8) = 0;
  (pFVar1->_ingredientA)._M_dataplus._M_p = (pointer)&(pFVar1->_ingredientA).field_2;
  (pFVar1->_ingredientA)._M_string_length = 0;
  (pFVar1->_ingredientB)._M_dataplus._M_p = (pointer)&(pFVar1->_ingredientB).field_2;
  (pFVar1->_ingredientB).field_2._M_local_buf[0] = '\0';
  this->_fodder = pFVar1;
  return;
}

Assistant:

SubFodderBuilderB::SubFodderBuilderB() {
	_fodder = new Fodder();
}